

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.h
# Opt level: O1

int lace_shrink_shared(WorkerP *w)

{
  Worker *pWVar1;
  __int_type_conflict1 _Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  pWVar1 = w->_public;
  _Var2 = (pWVar1->ts).v.super___atomic_base<unsigned_long>._M_i;
  uVar4 = (uint)_Var2;
  uVar3 = (uint)(_Var2 >> 0x20);
  if (uVar4 != uVar3) {
    uVar5 = uVar4 + uVar3 >> 1;
    *(uint *)((long)&pWVar1->ts + 4) = uVar5;
    uVar4 = *(uint *)&pWVar1->ts;
    if (uVar4 != uVar3) {
      if (uVar5 < uVar4) {
        uVar5 = uVar4 + uVar3 >> 1;
        *(uint *)((long)&pWVar1->ts + 4) = uVar5;
      }
      w->split = w->dq + uVar5;
      return 0;
    }
  }
  pWVar1->allstolen = '\x01';
  w->allstolen = '\x01';
  return 1;
}

Assistant:

static int
lace_shrink_shared(WorkerP *w)
{
    Worker *wt = w->_public;
    TailSplitNA ts; /* Use non-atomic version to emit better code */
    ts.v = wt->ts.v; /* Force in 1 memory read */
    uint32_t tail = ts.ts.tail;
    uint32_t split = ts.ts.split;

    if (tail != split) {
        uint32_t newsplit = (tail + split)/2;
        atomic_store_explicit(&wt->ts.ts.split, newsplit, memory_order_relaxed); /* emit normal write */
        atomic_thread_fence(memory_order_seq_cst);
        tail = wt->ts.ts.tail;
        if (tail != split) {
            if (unlikely(tail > newsplit)) {
                newsplit = (tail + split) / 2;
                atomic_store_explicit(&wt->ts.ts.split, newsplit, memory_order_relaxed); /* emit normal write */
            }
            w->split = w->dq + newsplit;
            PR_COUNTSPLITS(w, CTR_split_shrink);
            return 0;
        }
    }

    wt->allstolen = 1;
    w->allstolen = 1;
    return 1;
}